

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsInitializeCounters(IDALsMem idals_mem)

{
  idals_mem->njtsetup = 0;
  idals_mem->njtimes = 0;
  idals_mem->ncfl = 0;
  idals_mem->nreDQ = 0;
  idals_mem->nli = 0;
  idals_mem->nps = 0;
  idals_mem->nje = 0;
  idals_mem->npe = 0;
  return 0;
}

Assistant:

int idaLsInitializeCounters(IDALsMem idals_mem)
{
  idals_mem->nje      = 0;
  idals_mem->nreDQ    = 0;
  idals_mem->npe      = 0;
  idals_mem->nli      = 0;
  idals_mem->nps      = 0;
  idals_mem->ncfl     = 0;
  idals_mem->njtsetup = 0;
  idals_mem->njtimes  = 0;
  return (0);
}